

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O1

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::textData(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           *this,ParserChar *text,size_t textLength)

{
  ulong uVar1;
  undefined1 uVar2;
  int iVar3;
  _Elt_pointer pEVar4;
  ElementFunctionMap *pEVar5;
  _Rb_tree_header *p_Var6;
  INamespaceHandler *pIVar7;
  _Base_ptr p_Var8;
  _Base_ptr UNRECOVERED_JUMPTABLE;
  
  if (this->mIgnoreElements != 0) {
    return true;
  }
  if (this->mUnknownElements == 0) {
    if (this->mNamespaceElements == 0) {
      pEVar4 = (this->super_ParserTemplateBase).mElementDataStack.
               super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pEVar4 != (this->super_ParserTemplateBase).mElementDataStack.
                    super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (pEVar4 == (this->super_ParserTemplateBase).mElementDataStack.
                      super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pEVar4 = (this->super_ParserTemplateBase).mElementDataStack.
                   super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        uVar1 = pEVar4[-1].generatedElementHash;
        pEVar5 = &this->mElementFunctionMap;
        if (this->mCurrentElementFunctionMap != (ElementFunctionMap *)0x0) {
          pEVar5 = this->mCurrentElementFunctionMap;
        }
        p_Var6 = &(pEVar5->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (pEVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        UNRECOVERED_JUMPTABLE = &p_Var6->_M_header;
        for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar1]
            ) {
          if (*(ulong *)(p_Var8 + 1) >= uVar1) {
            UNRECOVERED_JUMPTABLE = p_Var8;
          }
        }
        p_Var8 = &p_Var6->_M_header;
        if (((_Rb_tree_header *)UNRECOVERED_JUMPTABLE != p_Var6) &&
           (p_Var8 = UNRECOVERED_JUMPTABLE, uVar1 < *(ulong *)(UNRECOVERED_JUMPTABLE + 1))) {
          p_Var8 = &p_Var6->_M_header;
        }
        if ((_Rb_tree_header *)p_Var8 == p_Var6) {
          return true;
        }
        UNRECOVERED_JUMPTABLE = p_Var8[1]._M_right;
        if (UNRECOVERED_JUMPTABLE != (_Base_ptr)0x0) {
          if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
            UNRECOVERED_JUMPTABLE =
                 *(_Base_ptr *)
                  (*(long *)((long)&(this->super_ParserTemplateBase).super_Parser._vptr_Parser +
                            *(long *)(p_Var8 + 2)) + -1 + (long)UNRECOVERED_JUMPTABLE);
          }
          uVar2 = (*(code *)UNRECOVERED_JUMPTABLE)();
          return (bool)uVar2;
        }
      }
      return false;
    }
    pIVar7 = this->mActiveNamespaceHandler;
  }
  else {
    pIVar7 = (INamespaceHandler *)this->mUnknownHandler;
    if (pIVar7 == (INamespaceHandler *)0x0) {
      return true;
    }
  }
  iVar3 = (*(*(_func_int ***)pIVar7)[4])();
  return SUB41(iVar3,0);
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::textData(const ParserChar* text,
															  size_t textLength)
	{
        if ( mIgnoreElements > 0 )
        {
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->textData( text, textLength );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            return mActiveNamespaceHandler->textData( text, textLength );
        }

        if ( mElementDataStack.empty() )
            return false;
        ElementData elementData = mElementDataStack.back();
        typename ElementFunctionMap::const_iterator it;

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
		it = functionMapToUse->find(elementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
			return true;
		const FunctionStruct& functions = it->second;

		if ( !functions.textDataFunction || !(static_cast<DerivedClass*>(this)->*functions.textDataFunction)(text, textLength) )
			return false;

		return true;
	}